

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManFindDivGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
              Vec_Int_t *vUnatePairs,Vec_Int_t *vUnateLitsW,Vec_Int_t *vUnatePairsW,word *pDivTemp)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  uint unaff_EBX;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  uVar10 = (ulong)(uint)nWords;
  if (nWords < 1) {
    iVar11 = 0;
  }
  else {
    uVar5 = 0;
    unaff_EBX = 0xf0f0f0f;
    iVar11 = 0;
    do {
      uVar7 = pOn[uVar5] - (pOn[uVar5] >> 1 & 0x5555555555555555);
      uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
      uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
      uVar7 = (uVar7 >> 8) + uVar7;
      lVar8 = (uVar7 >> 0x10) + uVar7;
      iVar11 = iVar11 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  if (vUnateLits->nSize < 1) {
    return -1;
  }
  lVar8 = 0;
LAB_0079cb57:
  if (vUnateLitsW->nSize <= lVar8) {
LAB_0079cde8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = vUnateLits->pArray[lVar8];
  if ((int)uVar1 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (vDivs->nSize <= (int)(uVar1 >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar2 = vUnateLitsW->pArray[lVar8];
  iVar4 = 2;
  if (iVar11 <= iVar2 * 2) {
    if (0 < vUnatePairs->nSize) {
      pvVar3 = vDivs->pArray[uVar1 >> 1];
      lVar9 = 0;
LAB_0079cbd9:
      if (lVar9 < vUnatePairsW->nSize) {
        uVar6 = vUnatePairs->pArray[lVar9];
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        iVar4 = 5;
        if (iVar11 <= vUnatePairsW->pArray[lVar9] + iVar2) {
          Gia_ManDeriveDivPair(uVar6,vDivs,nWords,pDivTemp);
          if ((uVar6 & 1) == 0 && (uVar1 & 1) == 0) {
            if (0 < nWords) {
              uVar5 = 0;
              do {
                if ((pOn[uVar5] & ~(pDivTemp[uVar5] | *(ulong *)((long)pvVar3 + uVar5 * 8))) != 0)
                goto LAB_0079cd76;
                uVar5 = uVar5 + 1;
              } while (uVar10 != uVar5);
            }
          }
          else if ((uVar1 & 1) == 0) {
            if (0 < nWords) {
              uVar5 = 0;
              do {
                if ((pOn[uVar5] & ~*(ulong *)((long)pvVar3 + uVar5 * 8) & pDivTemp[uVar5]) != 0)
                goto LAB_0079cd76;
                uVar5 = uVar5 + 1;
              } while (uVar10 != uVar5);
            }
          }
          else if ((uVar6 & 1) == 0) {
            if (0 < nWords) {
              uVar5 = 0;
              do {
                if ((pOn[uVar5] & ~pDivTemp[uVar5] & *(ulong *)((long)pvVar3 + uVar5 * 8)) != 0)
                goto LAB_0079cd76;
                uVar5 = uVar5 + 1;
              } while (uVar10 != uVar5);
            }
          }
          else if (0 < nWords) {
            uVar5 = 0;
            do {
              if ((pOn[uVar5] & pDivTemp[uVar5] & *(ulong *)((long)pvVar3 + uVar5 * 8)) != 0)
              goto LAB_0079cd76;
              uVar5 = uVar5 + 1;
            } while (uVar10 != uVar5);
          }
          uVar6 = (int)lVar9 << 0x10 | uVar1;
          if ((int)uVar6 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          unaff_EBX = uVar6 * 2 & 0xfffefffe ^ 0x10003;
          iVar4 = 1;
        }
        goto LAB_0079cd78;
      }
      goto LAB_0079cde8;
    }
    iVar4 = 0;
  }
  goto LAB_0079cdb2;
LAB_0079cd76:
  iVar4 = 0;
LAB_0079cd78:
  if (iVar4 != 0) {
    if (iVar4 == 5) {
      iVar4 = 0;
    }
    goto LAB_0079cdb2;
  }
  lVar9 = lVar9 + 1;
  if (vUnatePairs->nSize <= lVar9) goto code_r0x0079cd8c;
  goto LAB_0079cbd9;
code_r0x0079cd8c:
  iVar4 = 0;
LAB_0079cdb2:
  if (iVar4 != 0) {
    if (iVar4 == 2) {
      return -1;
    }
    return unaff_EBX;
  }
  lVar8 = lVar8 + 1;
  if (vUnateLits->nSize <= lVar8) {
    return -1;
  }
  goto LAB_0079cb57;
}

Assistant:

int Gia_ManFindDivGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnateLitsW, Vec_Int_t * vUnatePairsW, word * pDivTemp )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnateLits, vUnateLitsW, iDiv0, Cover0, i )
    {
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
        if ( 2*Cover0 < nTotal )
            break;
        Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv1, Cover1, k )
        {
            int fComp1 = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTemp );
            if ( Gia_ManDivCover(pOff, pOn, pDiv0, Abc_LitIsCompl(iDiv0), pDivTemp, fComp1, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(k, 1) << 15) | Abc_LitNot(iDiv0), 1);
        }
    }
    return -1;
}